

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O2

void __thiscall
slang::analysis::DataFlowAnalysis::joinState
          (DataFlowAnalysis *this,DataFlowState *result,DataFlowState *other)

{
  unsigned_long *puVar1;
  pointer pIVar2;
  undefined4 uVar3;
  size_t i;
  ulong uVar4;
  anon_union_56_2_f059aa1d_for_IntervalMap<unsigned_long,_std::monostate,_3U>_3
  *__return_storage_ptr__;
  long lVar5;
  anon_union_56_2_f059aa1d_for_IntervalMap<unsigned_long,_std::monostate,_3U>_3 local_d0;
  int local_98;
  undefined4 local_94;
  
  if (result->reachable == other->reachable) {
    uVar4 = (other->assigned).
            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len;
    if (uVar4 < (result->assigned).
                super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len) {
      SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::resize
                ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)result,
                 uVar4);
    }
    lVar5 = 0;
    for (uVar4 = 0;
        uVar4 < (result->assigned).
                super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len;
        uVar4 = uVar4 + 1) {
      IntervalMap<unsigned_long,_std::monostate,_3U>::intersection
                ((IntervalMap<unsigned_long,_std::monostate,_3U> *)&local_d0.rootLeaf,
                 (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                 ((long)&((result->assigned).
                          super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                         .data_)->field_0 + lVar5),
                 (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                 ((long)&((other->assigned).
                          super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                         .data_)->field_0 + lVar5),&this->bitMapAllocator);
      uVar3 = local_94;
      pIVar2 = (result->assigned).
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_;
      *(int *)((long)&pIVar2->height + lVar5) = local_98;
      local_94 = 0;
      puVar1 = (unsigned_long *)((long)&pIVar2->field_0 + lVar5);
      *(undefined4 *)((long)&pIVar2->rootSize + lVar5) = uVar3;
      if (local_98 == 0) {
        puVar1[6] = local_d0._48_8_;
      }
      puVar1[4] = local_d0.rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[2].left;
      puVar1[5] = local_d0.rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[2].right;
      puVar1[2] = local_d0.rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
      puVar1[3] = local_d0.rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].right;
      *puVar1 = local_d0.rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                .first[0].left;
      puVar1[1] = local_d0.rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
      lVar5 = lVar5 + 0x40;
    }
  }
  else if (result->reachable == false) {
    __return_storage_ptr__ = &local_d0;
    copyState((DataFlowState *)&__return_storage_ptr__->rootLeaf,this,other);
    DataFlowState::operator=(result,(DataFlowState *)&__return_storage_ptr__->rootLeaf);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
               &local_d0.rootLeaf,(EVP_PKEY_CTX *)&__return_storage_ptr__->rootLeaf);
  }
  return;
}

Assistant:

void DataFlowAnalysis::joinState(DataFlowState& result, const DataFlowState& other) {
    if (result.reachable == other.reachable) {
        if (result.assigned.size() > other.assigned.size())
            result.assigned.resize(other.assigned.size());

        for (size_t i = 0; i < result.assigned.size(); i++) {
            result.assigned[i] = result.assigned[i].intersection(other.assigned[i],
                                                                 bitMapAllocator);
        }
    }
    else if (!result.reachable) {
        result = copyState(other);
    }
}